

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_float64_suite::run(void)

{
  test_array8_float64_empty();
  test_array8_float64_one();
  test_array8_float64_two();
  fail_array8_float64_missing_one();
  fail_array8_float64_missing_two();
  fail_array8_float64_missing_three();
  fail_array8_float64_missing_four();
  fail_array8_float64_missing_five();
  fail_array8_float64_missing_six();
  fail_array8_float64_missing_seven();
  fail_array8_float64_missing_eight();
  fail_array8_float64_missing_length_one();
  fail_array8_float64_invalid_length();
  fail_array8_float64_overflow();
  test_array16_float64_empty();
  test_array16_float64_one();
  test_array16_float64_two();
  fail_array16_float64_missing_one();
  fail_array16_float64_missing_two();
  fail_array16_float64_missing_three();
  fail_array16_float64_missing_four();
  fail_array16_float64_missing_five();
  fail_array16_float64_missing_six();
  fail_array16_float64_missing_seven();
  fail_array16_float64_missing_eight();
  fail_array16_float64_missing_length_one();
  fail_array16_float64_missing_length_two();
  fail_array16_float64_invalid_length();
  test_array32_float64_empty();
  test_array32_float64_one();
  test_array32_float64_two();
  fail_array32_float64_missing_one();
  fail_array32_float64_missing_two();
  fail_array32_float64_missing_three();
  fail_array32_float64_missing_four();
  fail_array32_float64_missing_five();
  fail_array32_float64_missing_six();
  fail_array32_float64_missing_seven();
  fail_array32_float64_missing_eight();
  fail_array32_float64_missing_length_one();
  fail_array32_float64_missing_length_two();
  fail_array32_float64_missing_length_three();
  fail_array32_float64_missing_length_four();
  fail_array32_float64_invalid_length();
  test_array64_float64_empty();
  test_array64_float64_one();
  test_array64_float64_two();
  fail_array64_float64_missing_one();
  fail_array64_float64_missing_two();
  fail_array64_float64_missing_three();
  fail_array64_float64_missing_four();
  fail_array64_float64_missing_five();
  fail_array64_float64_missing_six();
  fail_array64_float64_missing_seven();
  fail_array64_float64_missing_eight();
  fail_array64_float64_missing_length_one();
  fail_array64_float64_missing_length_two();
  fail_array64_float64_missing_length_three();
  fail_array64_float64_missing_length_four();
  fail_array64_float64_missing_length_five();
  fail_array64_float64_missing_length_six();
  fail_array64_float64_missing_length_seven();
  fail_array64_float64_missing_length_eight();
  fail_array64_float64_invalid_length();
  return;
}

Assistant:

void run()
{
    test_array8_float64_empty();
    test_array8_float64_one();
    test_array8_float64_two();
    fail_array8_float64_missing_one();
    fail_array8_float64_missing_two();
    fail_array8_float64_missing_three();
    fail_array8_float64_missing_four();
    fail_array8_float64_missing_five();
    fail_array8_float64_missing_six();
    fail_array8_float64_missing_seven();
    fail_array8_float64_missing_eight();
    fail_array8_float64_missing_length_one();
    fail_array8_float64_invalid_length();
    fail_array8_float64_overflow();

    test_array16_float64_empty();
    test_array16_float64_one();
    test_array16_float64_two();
    fail_array16_float64_missing_one();
    fail_array16_float64_missing_two();
    fail_array16_float64_missing_three();
    fail_array16_float64_missing_four();
    fail_array16_float64_missing_five();
    fail_array16_float64_missing_six();
    fail_array16_float64_missing_seven();
    fail_array16_float64_missing_eight();
    fail_array16_float64_missing_length_one();
    fail_array16_float64_missing_length_two();
    fail_array16_float64_invalid_length();

    test_array32_float64_empty();
    test_array32_float64_one();
    test_array32_float64_two();
    fail_array32_float64_missing_one();
    fail_array32_float64_missing_two();
    fail_array32_float64_missing_three();
    fail_array32_float64_missing_four();
    fail_array32_float64_missing_five();
    fail_array32_float64_missing_six();
    fail_array32_float64_missing_seven();
    fail_array32_float64_missing_eight();
    fail_array32_float64_missing_length_one();
    fail_array32_float64_missing_length_two();
    fail_array32_float64_missing_length_three();
    fail_array32_float64_missing_length_four();
    fail_array32_float64_invalid_length();

    test_array64_float64_empty();
    test_array64_float64_one();
    test_array64_float64_two();
    fail_array64_float64_missing_one();
    fail_array64_float64_missing_two();
    fail_array64_float64_missing_three();
    fail_array64_float64_missing_four();
    fail_array64_float64_missing_five();
    fail_array64_float64_missing_six();
    fail_array64_float64_missing_seven();
    fail_array64_float64_missing_eight();
    fail_array64_float64_missing_length_one();
    fail_array64_float64_missing_length_two();
    fail_array64_float64_missing_length_three();
    fail_array64_float64_missing_length_four();
    fail_array64_float64_missing_length_five();
    fail_array64_float64_missing_length_six();
    fail_array64_float64_missing_length_seven();
    fail_array64_float64_missing_length_eight();
    fail_array64_float64_invalid_length();
}